

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator::GenerateInterfaceMembers
          (ImmutableEnumFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  Printer *printer_local;
  ImmutableEnumFieldLiteGenerator *this_local;
  
  pFVar2 = FieldDescriptor::file(this->descriptor_);
  bVar1 = SupportFieldPresence(pFVar2);
  if (bVar1) {
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,"$deprecation$boolean has$capitalized_name$();\n");
  }
  pFVar2 = FieldDescriptor::file(this->descriptor_);
  bVar1 = SupportUnknownEnumValue(pFVar2);
  if (bVar1) {
    WriteFieldDocComment(printer,this->descriptor_);
    io::Printer::Print(printer,&this->variables_,"$deprecation$int get$capitalized_name$Value();\n")
    ;
  }
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,&this->variables_,"$deprecation$$type$ get$capitalized_name$();\n");
  return;
}

Assistant:

void ImmutableEnumFieldLiteGenerator::
GenerateInterfaceMembers(io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$boolean has$capitalized_name$();\n");
  }
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$int get$capitalized_name$Value();\n");
  }
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$$type$ get$capitalized_name$();\n");
}